

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blocksets_decoder.cpp
# Opt level: O2

uint16_t decode_tile(BitstreamReader *bitstream,TileQueue *tile_queue)

{
  bool bVar1;
  uint32_t uVar2;
  
  bVar1 = BitstreamReader::next_bit(bitstream);
  if (bVar1) {
    uVar2 = BitstreamReader::read_bits(bitstream,'\x04');
    TileQueue::move_to_front(tile_queue,uVar2);
  }
  else {
    uVar2 = BitstreamReader::read_bits(bitstream,'\v');
    TileQueue::push_front(tile_queue,(uint16_t)uVar2);
  }
  return *(tile_queue->_tiles).super__Deque_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Deque_impl_data._M_start._M_cur;
}

Assistant:

static uint16_t decode_tile(BitstreamReader& bitstream, TileQueue& tile_queue)
{
    if(bitstream.next_bit())
    {
        uint32_t index = bitstream.read_bits(4);
        tile_queue.move_to_front(index);
    }
    else
    {
        uint32_t val = bitstream.read_bits(11);
        tile_queue.push_front(val);
    }

    return tile_queue.front();
}